

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Polynomial<double>::FindRealRoots(Polynomial<double> *this)

{
  reference pvVar1;
  reference __x;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  int i;
  DynamicVector<double,_std::allocator<double>_> imags;
  DynamicVector<double,_std::allocator<double>_> reals;
  Eigenvalue<double> eig;
  DynamicRectMatrix<double> companion;
  double fE_1;
  double fD_1;
  double fT1_1;
  double fT2_1;
  double fE;
  double fD;
  double fTminus;
  double fTplus;
  double fT2;
  double fT1;
  double fR;
  double fDiscr_2;
  double fY;
  vector<double,_std::allocator<double>_> cubeRoots;
  Polynomial<double> tempCubic;
  double fR2;
  double fR1;
  double fR0;
  double fInvC4;
  double fC0_3;
  double fC1_3;
  double fC2_2;
  double fC3_1;
  double fC4;
  double fTemp_1;
  double fSin;
  double fCos;
  double fAngle;
  double fDist;
  double fSqrt3;
  double root;
  double fTemp;
  double fDiscr_1;
  double fHalfB;
  double fB;
  double fA;
  double fOffset;
  double fTwentySeventh;
  double fThird;
  double fInvC3;
  double fC0_2;
  double fC1_2;
  double fC2_1;
  double fC3;
  double fTmp;
  double fDiscr;
  double fC0_1;
  double fC1_1;
  double fC2;
  double fC0;
  double fC1;
  int deg;
  double fEpsilon;
  vector<double,_std::allocator<double>_> *roots;
  allocator_type *in_stack_fffffffffffffbb8;
  Eigenvalue<double> *in_stack_fffffffffffffbc0;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffbc8;
  int exponent;
  Polynomial<double> *in_stack_fffffffffffffbd0;
  ExponentType EVar4;
  Eigenvalue<double> *this_00;
  Polynomial<double> *in_stack_fffffffffffffbd8;
  Polynomial<double> *in_stack_fffffffffffffc18;
  int local_370;
  Eigenvalue<double> local_369;
  DynamicRectMatrix<double> *in_stack_fffffffffffffd38;
  Eigenvalue<double> *in_stack_fffffffffffffd40;
  double local_268;
  double local_230;
  double local_228;
  double local_208;
  vector<double,_std::allocator<double>_> local_1f8;
  undefined8 local_1e0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  int local_20;
  undefined1 local_19;
  Polynomial<double> *this_01;
  
  this_01 = (Polynomial<double> *)0x3e45798ee2308c3a;
  local_19 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x334e79);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x334e86);
  local_20 = degree(in_stack_fffffffffffffbd0);
  EVar4 = (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  switch(local_20) {
  case 1:
    local_38 = getCoefficient(in_stack_fffffffffffffbd8,EVar4);
    local_40 = getCoefficient(in_stack_fffffffffffffbd8,
                              (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_48 = -local_40 / local_38;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
               (value_type_conflict2 *)in_stack_fffffffffffffbb8);
    break;
  case 2:
    local_58 = getCoefficient(in_stack_fffffffffffffbd8,EVar4);
    EVar4 = (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
    local_60 = getCoefficient(in_stack_fffffffffffffbd8,EVar4);
    local_68 = getCoefficient(in_stack_fffffffffffffbd8,EVar4);
    local_70 = local_60 * local_60 + local_68 * -4.0 * local_58;
    std::abs(in_ESI);
    if (extraout_XMM0_Qa <= 1e-08) {
      local_70 = 0.0;
    }
    if (0.0 <= local_70) {
      local_78 = 0.5 / local_58;
      if (local_70 <= 0.0) {
        local_90 = -local_78 * local_60;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
      }
      else {
        local_70 = sqrt(local_70);
        local_80 = local_78 * (-local_60 - local_70);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        local_88 = local_78 * (local_70 - local_60);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
      }
    }
    break;
  case 3:
    local_98 = getCoefficient(in_stack_fffffffffffffbd8,EVar4);
    local_a0 = getCoefficient(in_stack_fffffffffffffbd8,
                              (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_a8 = getCoefficient(in_stack_fffffffffffffbd8,
                              (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_b0 = getCoefficient(in_stack_fffffffffffffbd8,
                              (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_b8 = 1.0 / local_98;
    local_b0 = local_b8 * local_b0;
    local_a8 = local_b8 * local_a8;
    local_a0 = local_b8 * local_a0;
    local_c0 = 0x3fd5555555555555;
    local_c8 = 0x3fa2f684bda12f68;
    local_d0 = local_a0 * 0.3333333333333333;
    local_d8 = -local_a0 * local_d0 + local_a8;
    local_e0 = local_a0 * (local_a0 * 2.0 * local_a0 + -(local_a8 * 9.0)) * 0.037037037037037035 +
               local_b0;
    local_e8 = local_e0 * 0.5;
    local_f0 = local_e8 * local_e8 + local_d8 * local_d8 * local_d8 * 0.037037037037037035;
    if (ABS(local_f0) <= 1e-08) {
      local_f0 = 0.0;
    }
    if (local_f0 <= 0.0) {
      if (0.0 <= local_f0) {
        if (local_e8 < 0.0) {
          local_148 = pow(-local_e8,0.3333333333333333);
        }
        else {
          local_148 = pow(local_e8,0.3333333333333333);
          local_148 = -local_148;
        }
        local_150 = (local_148 + local_148) - local_d0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        local_158 = -local_148 - local_d0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        local_160 = -local_148 - local_d0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
      }
      else {
        local_108 = sqrt(3.0);
        local_110 = sqrt(local_d8 * -0.3333333333333333);
        dVar2 = sqrt(-local_f0);
        local_118 = atan2(dVar2,-local_e8);
        local_118 = local_118 * 0.3333333333333333;
        local_120 = cos(local_118);
        local_128 = sin(local_118);
        local_130 = (local_110 + local_110) * local_120 - local_d0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        local_138 = -local_110 * (local_108 * local_128 + local_120) - local_d0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        local_140 = -local_110 * (local_120 - local_108 * local_128) - local_d0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
      }
    }
    else {
      local_f0 = sqrt(local_f0);
      local_f8 = -local_e8 + local_f0;
      if (local_f8 < 0.0) {
        local_100 = pow(-local_f8,0.3333333333333333);
        local_100 = -local_100;
      }
      else {
        local_100 = pow(local_f8,0.3333333333333333);
      }
      local_f8 = -local_e8 - local_f0;
      if (local_f8 < 0.0) {
        dVar2 = pow(-local_f8,0.3333333333333333);
        local_100 = local_100 - dVar2;
      }
      else {
        dVar2 = pow(local_f8,0.3333333333333333);
        local_100 = dVar2 + local_100;
      }
      local_100 = local_100 - local_d0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbd0,
                 (value_type_conflict2 *)in_stack_fffffffffffffbc8);
    }
    break;
  case 4:
    local_168 = getCoefficient(in_stack_fffffffffffffbd8,EVar4);
    exponent = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
    local_170 = getCoefficient(in_stack_fffffffffffffbd8,
                               (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_178 = getCoefficient(in_stack_fffffffffffffbd8,
                               (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_180 = getCoefficient(in_stack_fffffffffffffbd8,
                               (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_188 = getCoefficient(in_stack_fffffffffffffbd8,
                               (ExponentType)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_190 = 1.0 / local_168;
    local_188 = local_188 * local_190;
    local_180 = local_180 * local_190;
    local_178 = local_178 * local_190;
    local_170 = local_170 * local_190;
    local_198 = (local_178 * 4.0 * local_188 - local_170 * local_170 * local_188) -
                local_180 * local_180;
    local_1a0 = local_170 * local_180 - local_188 * 4.0;
    local_1a8 = -local_178;
    Polynomial((Polynomial<double> *)0x335bb3);
    setCoefficient(in_stack_fffffffffffffbd0,exponent,(double *)in_stack_fffffffffffffbc0);
    setCoefficient(in_stack_fffffffffffffbd0,exponent,(double *)in_stack_fffffffffffffbc0);
    setCoefficient(in_stack_fffffffffffffbd0,exponent,(double *)in_stack_fffffffffffffbc0);
    local_1e0 = 0x3ff0000000000000;
    setCoefficient(in_stack_fffffffffffffbd0,exponent,(double *)in_stack_fffffffffffffbc0);
    FindRealRoots(this_01);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_1f8,0);
    dVar2 = *pvVar1;
    local_208 = local_170 * 0.25 * local_170 + -local_178 + dVar2;
    if (ABS(local_208) <= 1e-08) {
      local_208 = 0.0;
    }
    if (local_208 <= 0.0) {
      if ((0.0 <= local_208) &&
         (local_268 = dVar2 * dVar2 + -(local_188 * 4.0), -1e-08 <= local_268)) {
        if (local_268 < 0.0) {
          local_268 = 0.0;
        }
        dVar2 = sqrt(local_268);
        dVar2 = dVar2 * 2.0;
        dVar3 = local_170 * 0.75 * local_170 + -(local_178 * 2.0);
        if (1e-08 <= dVar3 + dVar2) {
          sqrt(dVar3 + dVar2);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                     (value_type_conflict2 *)in_stack_fffffffffffffbb8);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                     (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        }
        if (1e-08 <= dVar3 - dVar2) {
          sqrt(dVar3 - dVar2);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                     (value_type_conflict2 *)in_stack_fffffffffffffbb8);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                     (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        }
      }
    }
    else {
      dVar2 = sqrt(local_208);
      local_230 = (local_170 * 0.75 * local_170 + -(dVar2 * dVar2)) - (local_178 + local_178);
      dVar2 = (-(local_170 * local_170) * local_170 +
              local_170 * 4.0 * local_178 + -(local_180 * 8.0)) / (dVar2 * 4.0);
      local_228 = local_230 + dVar2;
      local_230 = local_230 - dVar2;
      if (ABS(local_228) <= 1e-08) {
        local_228 = 0.0;
      }
      if (ABS(local_230) <= 1e-08) {
        local_230 = 0.0;
      }
      if (0.0 <= local_228) {
        sqrt(local_228);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
      }
      if (0.0 <= local_230) {
        sqrt(local_230);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbd0);
    ~Polynomial((Polynomial<double> *)0x3363b9);
    break;
  default:
    CreateCompanion(in_stack_fffffffffffffc18);
    JAMA::Eigenvalue<double>::Eigenvalue(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::allocator<double>::allocator((allocator<double> *)0x336423);
    DynamicVector<double,_std::allocator<double>_>::DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbb8);
    std::allocator<double>::~allocator((allocator<double> *)0x336444);
    this_00 = &local_369;
    std::allocator<double>::allocator((allocator<double> *)0x336456);
    DynamicVector<double,_std::allocator<double>_>::DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbb8);
    std::allocator<double>::~allocator((allocator<double> *)0x336477);
    JAMA::Eigenvalue<double>::getRealEigenvalues(this_00,in_stack_fffffffffffffbc8);
    JAMA::Eigenvalue<double>::getImagEigenvalues
              (in_stack_fffffffffffffbc0,
               (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbb8);
    for (local_370 = 0; local_370 < local_20; local_370 = local_370 + 1) {
      __x = DynamicVector<double,_std::allocator<double>_>::operator()
                      ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                       (size_type)in_stack_fffffffffffffbb8);
      if (ABS(*__x) < 1e-08) {
        in_stack_fffffffffffffbc0 =
             (Eigenvalue<double> *)
             DynamicVector<double,_std::allocator<double>_>::operator()
                       ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
                        (size_type)in_stack_fffffffffffffbb8);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)this_00,__x);
      }
    }
    DynamicVector<double,_std::allocator<double>_>::~DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)0x3365e8);
    DynamicVector<double,_std::allocator<double>_>::~DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)0x3365f5);
    JAMA::Eigenvalue<double>::~Eigenvalue(in_stack_fffffffffffffbc0);
    DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x33660f);
  }
  return in_RDI;
}

Assistant:

std::vector<Real> FindRealRoots() {
      const Real fEpsilon = 1.0e-8;
      std::vector<Real> roots;
      roots.clear();

      const int deg = degree();

      switch (deg) {
      case 1: {
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);
        roots.push_back(-fC0 / fC1);
        return roots;
      }
      case 2: {
        Real fC2    = getCoefficient(2);
        Real fC1    = getCoefficient(1);
        Real fC0    = getCoefficient(0);
        Real fDiscr = fC1 * fC1 - 4.0 * fC0 * fC2;
        if (abs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr < (Real)0.0) {  // complex roots only
          return roots;
        }

        Real fTmp = ((Real)0.5) / fC2;

        if (fDiscr > (Real)0.0) {  // 2 real roots
          fDiscr = sqrt(fDiscr);
          roots.push_back(fTmp * (-fC1 - fDiscr));
          roots.push_back(fTmp * (-fC1 + fDiscr));
        } else {
          roots.push_back(-fTmp * fC1);  // 1 real root
        }
      }
        return roots;
      case 3: {
        Real fC3 = getCoefficient(3);
        Real fC2 = getCoefficient(2);
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);

        // make polynomial monic, x^3+c2*x^2+c1*x+c0
        Real fInvC3 = ((Real)1.0) / fC3;
        fC0 *= fInvC3;
        fC1 *= fInvC3;
        fC2 *= fInvC3;

        // convert to y^3+a*y+b = 0 by x = y-c2/3
        const Real fThird         = (Real)1.0 / (Real)3.0;
        const Real fTwentySeventh = (Real)1.0 / (Real)27.0;
        Real fOffset              = fThird * fC2;
        Real fA                   = fC1 - fC2 * fOffset;
        Real fB = fC0 + fC2 * (((Real)2.0) * fC2 * fC2 - ((Real)9.0) * fC1) *
                            fTwentySeventh;
        Real fHalfB = ((Real)0.5) * fB;

        Real fDiscr = fHalfB * fHalfB + fA * fA * fA * fTwentySeventh;
        if (fabs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr > (Real)0.0) {  // 1 real, 2 complex roots

          fDiscr     = sqrt(fDiscr);
          Real fTemp = -fHalfB + fDiscr;
          Real root;
          if (fTemp >= (Real)0.0) {
            root = pow(fTemp, fThird);
          } else {
            root = -pow(-fTemp, fThird);
          }
          fTemp = -fHalfB - fDiscr;
          if (fTemp >= (Real)0.0) {
            root += pow(fTemp, fThird);
          } else {
            root -= pow(-fTemp, fThird);
          }
          root -= fOffset;

          roots.push_back(root);
        } else if (fDiscr < (Real)0.0) {
          const Real fSqrt3 = sqrt((Real)3.0);
          Real fDist        = sqrt(-fThird * fA);
          Real fAngle       = fThird * atan2(sqrt(-fDiscr), -fHalfB);
          Real fCos         = cos(fAngle);
          Real fSin         = sin(fAngle);
          roots.push_back(((Real)2.0) * fDist * fCos - fOffset);
          roots.push_back(-fDist * (fCos + fSqrt3 * fSin) - fOffset);
          roots.push_back(-fDist * (fCos - fSqrt3 * fSin) - fOffset);
        } else {
          Real fTemp;
          if (fHalfB >= (Real)0.0) {
            fTemp = -pow(fHalfB, fThird);
          } else {
            fTemp = pow(-fHalfB, fThird);
          }
          roots.push_back(((Real)2.0) * fTemp - fOffset);
          roots.push_back(-fTemp - fOffset);
          roots.push_back(-fTemp - fOffset);
        }
      }
        return roots;
      case 4: {
        Real fC4 = getCoefficient(4);
        Real fC3 = getCoefficient(3);
        Real fC2 = getCoefficient(2);
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);

        // make polynomial monic, x^4+c3*x^3+c2*x^2+c1*x+c0
        Real fInvC4 = ((Real)1.0) / fC4;
        fC0 *= fInvC4;
        fC1 *= fInvC4;
        fC2 *= fInvC4;
        fC3 *= fInvC4;

        // reduction to resolvent cubic polynomial y^3+r2*y^2+r1*y+r0 = 0
        Real fR0 = -fC3 * fC3 * fC0 + ((Real)4.0) * fC2 * fC0 - fC1 * fC1;
        Real fR1 = fC3 * fC1 - ((Real)4.0) * fC0;
        Real fR2 = -fC2;
        Polynomial<Real> tempCubic;
        tempCubic.setCoefficient(0, fR0);
        tempCubic.setCoefficient(1, fR1);
        tempCubic.setCoefficient(2, fR2);
        tempCubic.setCoefficient(3, 1.0);
        std::vector<Real> cubeRoots = tempCubic.FindRealRoots();  // always
        // produces
        // at
        // least
        // one
        // root
        Real fY = cubeRoots[0];

        Real fDiscr = ((Real)0.25) * fC3 * fC3 - fC2 + fY;
        if (fabs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr > (Real)0.0) {
          Real fR  = sqrt(fDiscr);
          Real fT1 = ((Real)0.75) * fC3 * fC3 - fR * fR - ((Real)2.0) * fC2;
          Real fT2 =
              (((Real)4.0) * fC3 * fC2 - ((Real)8.0) * fC1 - fC3 * fC3 * fC3) /
              (((Real)4.0) * fR);

          Real fTplus  = fT1 + fT2;
          Real fTminus = fT1 - fT2;
          if (fabs(fTplus) <= fEpsilon) { fTplus = (Real)0.0; }
          if (fabs(fTminus) <= fEpsilon) { fTminus = (Real)0.0; }

          if (fTplus >= (Real)0.0) {
            Real fD = sqrt(fTplus);
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fR + fD));
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fR - fD));
          }
          if (fTminus >= (Real)0.0) {
            Real fE = sqrt(fTminus);
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fE - fR));
            roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * (fE + fR));
          }
        } else if (fDiscr < (Real)0.0) {
          // roots.clear();
        } else {
          Real fT2 = fY * fY - ((Real)4.0) * fC0;
          if (fT2 >= -fEpsilon) {
            if (fT2 < (Real)0.0) {  // round to zero
              fT2 = (Real)0.0;
            }
            fT2      = ((Real)2.0) * sqrt(fT2);
            Real fT1 = ((Real)0.75) * fC3 * fC3 - ((Real)2.0) * fC2;
            if (fT1 + fT2 >= fEpsilon) {
              Real fD = sqrt(fT1 + fT2);
              roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * fD);
              roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * fD);
            }
            if (fT1 - fT2 >= fEpsilon) {
              Real fE = sqrt(fT1 - fT2);
              roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * fE);
              roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * fE);
            }
          }
        }
      }
        return roots;
      default: {
        DynamicRectMatrix<Real> companion = CreateCompanion();
        JAMA::Eigenvalue<Real> eig(companion);
        DynamicVector<Real> reals, imags;
        eig.getRealEigenvalues(reals);
        eig.getImagEigenvalues(imags);

        for (int i = 0; i < deg; i++) {
          if (fabs(imags(i)) < fEpsilon) roots.push_back(reals(i));
        }
      }
        return roots;
      }
    }